

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

char * __thiscall
AccountingTestMemoryAllocator::alloc_memory
          (AccountingTestMemoryAllocator *this,size_t size,char *file,size_t line)

{
  char *memory_00;
  AccountingTestMemoryAllocator *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  size_t in_RDI;
  char *memory;
  size_t in_stack_ffffffffffffffd8;
  
  MemoryAccountant::alloc((MemoryAccountant *)in_RCX,in_stack_ffffffffffffffd8);
  memory_00 = (char *)(**(code **)(**(long **)(in_RDI + 0x30) + 0x10))
                                (*(long **)(in_RDI + 0x30),in_RSI,in_RDX,in_RCX);
  addMemoryToMemoryTrackingToKeepTrackOfSize(in_RCX,memory_00,in_RDI);
  return memory_00;
}

Assistant:

char* AccountingTestMemoryAllocator::alloc_memory(size_t size, const char* file, size_t line)
{
    accountant_.alloc(size);
    char* memory = originalAllocator_->alloc_memory(size, file, line);
    addMemoryToMemoryTrackingToKeepTrackOfSize(memory, size);
    return memory;
}